

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginVST2.cpp
# Opt level: O2

void __thiscall
DISTRHO::ParameterAndNotesHelper::~ParameterAndNotesHelper(ParameterAndNotesHelper *this)

{
  ~ParameterAndNotesHelper(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ParameterAndNotesHelper()
    {
        if (parameterValues != nullptr)
        {
            delete[] parameterValues;
            parameterValues = nullptr;
        }
#if DISTRHO_PLUGIN_HAS_UI
        if (parameterChecks != nullptr)
        {
            delete[] parameterChecks;
            parameterChecks = nullptr;
        }
#endif
    }